

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SoundEmu.c
# Opt level: O2

char * SndEmu_GetDevName(UINT8 deviceID,UINT8 opts,DEV_GEN_CFG *devCfg)

{
  char cVar1;
  short sVar2;
  char *pcVar3;
  DEV_GEN_CFG *pDVar4;
  ulong uVar5;
  char *pcVar6;
  undefined3 in_register_00000039;
  bool bVar7;
  
  pDVar4 = (DEV_GEN_CFG *)0x0;
  if ((opts & 1) != 0) {
    pDVar4 = devCfg;
  }
  switch(CONCAT31(in_register_00000039,deviceID)) {
  case 0:
    if (pDVar4 == (DEV_GEN_CFG *)0x0) {
      return "SN76496";
    }
    if (pDVar4->flags != '\0') {
      return "T6W28";
    }
    cVar1 = *(char *)((long)&pDVar4[1].emuCore + 2);
    if (cVar1 == '\x11') {
      bVar7 = pDVar4[1].srMode == '\x01';
      pcVar6 = "SN76494";
      pcVar3 = "SN76489A";
    }
    else if (cVar1 == '\x10') {
      sVar2 = (short)pDVar4[1].emuCore;
      if (sVar2 == 9) {
        return "SEGA PSG";
      }
      if (sVar2 != 0x22) {
        return "SN76496";
      }
      if (pDVar4[1].flags == '\0') {
        return "NCR8496";
      }
      bVar7 = *(char *)((long)&pDVar4[1].emuCore + 3) == '\0';
      pcVar6 = "PSSJ-3";
      pcVar3 = "NCR8496";
    }
    else {
      if (cVar1 != '\x0f') {
        return "SN764xx";
      }
      bVar7 = pDVar4[1].srMode == '\x01';
      pcVar6 = "SN94624";
      pcVar3 = "SN76489";
    }
    break;
  case 1:
    if ((pDVar4 != (DEV_GEN_CFG *)0x0) && (pDVar4->flags != '\0')) {
      return "VRC7";
    }
    return "YM2413";
  case 2:
    if ((pDVar4 != (DEV_GEN_CFG *)0x0) && (pDVar4->flags != '\0')) {
      return "YM3438";
    }
    return "YM2612";
  case 3:
    return "YM2151";
  case 4:
    bVar7 = (opts & 1) == 0;
    pcVar6 = "SegaPCM";
    pcVar3 = "Sega PCM";
    break;
  case 5:
    if (pDVar4 == (DEV_GEN_CFG *)0x0) {
      return "RF5C68";
    }
    pcVar3 = "RF5C68";
    if (pDVar4->flags == '\x02') {
      pcVar3 = "RF5C105";
    }
    pcVar6 = "RF5C164";
    if (pDVar4->flags != '\x01') {
      pcVar6 = pcVar3;
    }
    return pcVar6;
  case 6:
    return "YM2203";
  case 7:
    return "YM2608";
  case 8:
    if ((pDVar4 != (DEV_GEN_CFG *)0x0) && (pDVar4->flags != '\0')) {
      return "YM2610B";
    }
    return "YM2610";
  case 9:
    return "YM3812";
  case 10:
    return "YM3526";
  case 0xb:
    return "Y8950";
  case 0xc:
    return "YMF262";
  case 0xd:
    return "YMF278B";
  case 0xe:
    return "YMF271";
  case 0xf:
    return "YMZ280B";
  case 0x10:
    return (char *)0x0;
  case 0x11:
    return "32X PWM";
  case 0x12:
    if ((pDVar4 != (DEV_GEN_CFG *)0x0) && (uVar5 = (ulong)(byte)pDVar4[1].emuCore, uVar5 < 0x14)) {
      return &DAT_0015dcc4 + *(int *)(&DAT_0015dcc4 + uVar5 * 4);
    }
    return "AY8910";
  case 0x13:
    bVar7 = (opts & 1) == 0;
    pcVar6 = "GB DMG";
    pcVar3 = "GameBoy DMG";
    break;
  case 0x14:
    if ((pDVar4 != (DEV_GEN_CFG *)0x0) && (pDVar4->flags != '\0')) {
      return "NES APU + FDS";
    }
    return "NES APU";
  case 0x15:
    return "YMW258";
  case 0x16:
    return "uPD7759";
  case 0x17:
    return "OKIM6258";
  case 0x18:
    return "OKIM6295";
  case 0x19:
    if ((pDVar4 != (DEV_GEN_CFG *)0x0) && (pDVar4->flags != '\0')) {
      return "K052539";
    }
    return "K051649";
  case 0x1a:
    return "K054539";
  case 0x1b:
    return "C6280";
  case 0x1c:
    return "C140";
  case 0x1d:
    return "K053260";
  case 0x1e:
    return "Pokey";
  case 0x1f:
    return "QSound";
  case 0x20:
    return "SCSP";
  case 0x21:
    bVar7 = (opts & 1) == 0;
    pcVar6 = "WSwan";
    pcVar3 = "WonderSwan";
    break;
  case 0x22:
    return "VBoy VSU";
  case 0x23:
    return "SAA1099";
  case 0x24:
    return "ES5503";
  case 0x25:
    if ((pDVar4 != (DEV_GEN_CFG *)0x0) && (pDVar4->flags == '\0')) {
      return "ES5505";
    }
    return "ES5506";
  case 0x26:
    return "X1-010";
  case 0x27:
    return "C352";
  case 0x28:
    return "GA20";
  case 0x29:
    return "MIKEY";
  default:
    if (CONCAT31(in_register_00000039,deviceID) != 0x80) {
      return (char *)0x0;
    }
    return "C219";
  }
  if (bVar7) {
    pcVar3 = pcVar6;
  }
  return pcVar3;
}

Assistant:

const char* SndEmu_GetDevName(UINT8 deviceID, UINT8 opts, const DEV_GEN_CFG* devCfg)
{
	if (! (opts & 0x01))
		devCfg = NULL;	// devCfg only has an effect when "long names" are enabled
	switch(deviceID)
	{
#ifdef SNDDEV_SN76496
	case DEVID_SN76496:
		if (devCfg != NULL)
		{
			const SN76496_CFG* snCfg = (const SN76496_CFG*)devCfg;
			if (snCfg->_genCfg.flags)
				return "T6W28";
			switch(snCfg->shiftRegWidth)
			{
			case 0x0F:
				return (snCfg->clkDiv == 1) ? "SN94624" : "SN76489";
			case 0x10:
				if (snCfg->noiseTaps == 0x0009)
					return "SEGA PSG";
				else if (snCfg->noiseTaps == 0x0022)
				{
					if (snCfg->ncrPSG)	// Tandy noise mode
						return snCfg->negate ? "NCR8496" : "PSSJ-3";
					else
						return "NCR8496";
				}
				break;
			case 0x11:
				return (snCfg->clkDiv == 1) ? "SN76494" : "SN76489A";
			default:
				return "SN764xx";
			}
		}
		return "SN76496";
#endif
#ifdef SNDDEV_YM2413
	case DEVID_YM2413:
		if (devCfg != NULL && devCfg->flags)
			return "VRC7";
		return "YM2413";
#endif
#ifdef SNDDEV_YM2612
	case DEVID_YM2612:
		if (devCfg != NULL && devCfg->flags)
			return "YM3438";
		return "YM2612";
#endif
#ifdef SNDDEV_YM2151
	case DEVID_YM2151:
		return "YM2151";
#endif
#ifdef SNDDEV_SEGAPCM
	case DEVID_SEGAPCM:
		if (opts & 0x01)
			return "Sega PCM";
		return "SegaPCM";
#endif
#ifdef SNDDEV_RF5C68
	case DEVID_RF5C68:
		if (devCfg != NULL)
		{
			if (devCfg->flags == 1)
				return "RF5C164";
			else if (devCfg->flags == 2)
				return "RF5C105";
		}
		return "RF5C68";
#endif
#ifdef SNDDEV_YM2203
	case DEVID_YM2203:
		return "YM2203";
#endif
#ifdef SNDDEV_YM2608
	case DEVID_YM2608:
		return "YM2608";
#endif
#ifdef SNDDEV_YM2610
	case DEVID_YM2610:
		if (devCfg != NULL && devCfg->flags)
			return "YM2610B";
		return "YM2610";
#endif
#ifdef SNDDEV_YM3812
	case DEVID_YM3812:
		return "YM3812";
#endif
#ifdef SNDDEV_YM3526
	case DEVID_YM3526:
		return "YM3526";
#endif
#ifdef SNDDEV_Y8950
	case DEVID_Y8950:
		return "Y8950";
#endif
#ifdef SNDDEV_YMF262
	case DEVID_YMF262:
		return "YMF262";
#endif
#ifdef SNDDEV_YMF278B
	case DEVID_YMF278B:
		return "YMF278B";
#endif
#ifdef SNDDEV_YMF271
	case DEVID_YMF271:
		return "YMF271";
#endif
#ifdef SNDDEV_YMZ280B
	case DEVID_YMZ280B:
		return "YMZ280B";
#endif
#ifdef SNDDEV_32X_PWM
	case DEVID_32X_PWM:
		return "32X PWM";
#endif
#ifdef SNDDEV_AY8910
	case DEVID_AY8910:
		if (devCfg != NULL)
		{
			const AY8910_CFG* ayCfg = (const AY8910_CFG*)devCfg;
			switch(ayCfg->chipType)
			{
			case 0x00:
				return "AY-3-8910";
			case 0x01:
				return "AY-3-8912";
			case 0x02:
				return "AY-3-8913";
			case 0x03:
				return "AY8930";
			case 0x04:
				return "AY-3-8914";
			case 0x10:
				return "YM2149";
			case 0x11:
				return "YM3439";
			case 0x12:
				return "YMZ284";
			case 0x13:
				return "YMZ294";
			}
		}
		return "AY8910";
#endif
#ifdef SNDDEV_GAMEBOY
	case DEVID_GB_DMG:
		if (opts & 0x01)
			return "GameBoy DMG";
		return "GB DMG";
#endif
#ifdef SNDDEV_NES_APU
	case DEVID_NES_APU:
		if (devCfg != NULL && devCfg->flags)
			return "NES APU + FDS";
		return "NES APU";
#endif
#ifdef SNDDEV_YMW258
	case DEVID_YMW258:
		return "YMW258";
#endif
#ifdef SNDDEV_UPD7759
	case DEVID_uPD7759:
		return "uPD7759";
#endif
#ifdef SNDDEV_OKIM6258
	case DEVID_OKIM6258:
		return "OKIM6258";
#endif
#ifdef SNDDEV_OKIM6295
	case DEVID_OKIM6295:
		return "OKIM6295";
#endif
#ifdef SNDDEV_K051649
	case DEVID_K051649:
		if (devCfg != NULL && devCfg->flags)
			return "K052539";
		return "K051649";
#endif
#ifdef SNDDEV_K054539
	case DEVID_K054539:
		return "K054539";
#endif
#ifdef SNDDEV_C6280
	case DEVID_C6280:
		return "C6280";
#endif
#ifdef SNDDEV_C140
	case DEVID_C140:
		return "C140";
#endif
#ifdef SNDDEV_C219
	case DEVID_C219:
		return "C219";
#endif
#ifdef SNDDEV_K053260
	case DEVID_K053260:
		return "K053260";
#endif
#ifdef SNDDEV_POKEY
	case DEVID_POKEY:
		return "Pokey";
#endif
#ifdef SNDDEV_QSOUND
	case DEVID_QSOUND:
		return "QSound";
#endif
#ifdef SNDDEV_SCSP
	case DEVID_SCSP:
		return "SCSP";
#endif
#ifdef SNDDEV_WSWAN
	case DEVID_WSWAN:
		if (opts & 0x01)
			return "WonderSwan";
		return "WSwan";
#endif
#ifdef SNDDEV_VBOY_VSU
	case DEVID_VBOY_VSU:
		return "VBoy VSU";
#endif
#ifdef SNDDEV_SAA1099
	case DEVID_SAA1099:
		return "SAA1099";
#endif
#ifdef SNDDEV_ES5503
	case DEVID_ES5503:
		return "ES5503";
#endif
#ifdef SNDDEV_ES5506
	case DEVID_ES5506:
		if (devCfg != NULL && ! devCfg->flags)
			return "ES5505";
		return "ES5506";
#endif
#ifdef SNDDEV_X1_010
	case DEVID_X1_010:
		return "X1-010";
#endif
#ifdef SNDDEV_C352
	case DEVID_C352:
		return "C352";
#endif
#ifdef SNDDEV_GA20
	case DEVID_GA20:
		return "GA20";
#endif
#ifdef SNDDEV_MIKEY
	case DEVID_MIKEY:
		return "MIKEY";
#endif
	default:
		return NULL;
	}
}